

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

idx_t duckdb::BinaryExecutor::SelectGeneric<unsigned_short,unsigned_short,duckdb::Equals>
                (Vector *left,Vector *right,SelectionVector *sel,idx_t count,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  idx_t iVar1;
  UnifiedVectorFormat rdata;
  UnifiedVectorFormat ldata;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
  UnifiedVectorFormat::UnifiedVectorFormat(&rdata);
  Vector::ToUnifiedFormat(left,count,&ldata);
  Vector::ToUnifiedFormat(right,count,&rdata);
  iVar1 = SelectGenericLoopSwitch<unsigned_short,unsigned_short,duckdb::Equals>
                    ((unsigned_short *)ldata.data,(unsigned_short *)rdata.data,ldata.sel,rdata.sel,
                     sel,count,&ldata.validity,&rdata.validity,true_sel,false_sel);
  UnifiedVectorFormat::~UnifiedVectorFormat(&rdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
  return iVar1;
}

Assistant:

static idx_t SelectGeneric(Vector &left, Vector &right, const SelectionVector *sel, idx_t count,
	                           SelectionVector *true_sel, SelectionVector *false_sel) {
		UnifiedVectorFormat ldata, rdata;

		left.ToUnifiedFormat(count, ldata);
		right.ToUnifiedFormat(count, rdata);

		return SelectGenericLoopSwitch<LEFT_TYPE, RIGHT_TYPE, OP>(
		    UnifiedVectorFormat::GetData<LEFT_TYPE>(ldata), UnifiedVectorFormat::GetData<RIGHT_TYPE>(rdata), ldata.sel,
		    rdata.sel, sel, count, ldata.validity, rdata.validity, true_sel, false_sel);
	}